

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

int __thiscall luna::Function::AddConstValue(Function *this,Value *v)

{
  size_type sVar1;
  value_type *in_RDI;
  vector<luna::Value,_std::allocator<luna::Value>_> *unaff_retaddr;
  
  std::vector<luna::Value,_std::allocator<luna::Value>_>::push_back(unaff_retaddr,in_RDI);
  sVar1 = std::vector<luna::Value,_std::allocator<luna::Value>_>::size
                    ((vector<luna::Value,_std::allocator<luna::Value>_> *)&in_RDI[4].type_);
  return (int)sVar1 + -1;
}

Assistant:

int Function::AddConstValue(const Value &v)
    {
        const_values_.push_back(v);
        return const_values_.size() - 1;
    }